

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O0

void __thiscall
Eigen::EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::doComputeEigenvectors
          (EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this)

{
  int iVar1;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *pDVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  double *pdVar5;
  int iVar6;
  long in_RDI;
  Scalar SVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  type tVar11;
  type tVar12;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double dVar13;
  undefined8 uVar14;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_> *pDVar15;
  Index j_1;
  Scalar t_2;
  complex<double> cc_2;
  Scalar vi;
  Scalar vr;
  Scalar y_1;
  Scalar x_1;
  complex<double> cc_1;
  Scalar w_1;
  Scalar sa;
  Scalar ra;
  Index i_1;
  complex<double> cc;
  Index l_1;
  Scalar lastw_1;
  Scalar lastsa;
  Scalar lastra;
  Scalar t;
  Scalar t_1;
  Scalar denom;
  Scalar y;
  Scalar x;
  Scalar r;
  Scalar w;
  Index i;
  Index l;
  Scalar lastw;
  Scalar lastr;
  Scalar q;
  Scalar p;
  Index n;
  Index j;
  Scalar norm;
  Scalar eps;
  Index size;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffff808;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>
  *in_stack_fffffffffffff810;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffff818;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>
  *in_stack_fffffffffffff820;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>
  *in_stack_fffffffffffff828;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffff830;
  Scalar *in_stack_fffffffffffff848;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *in_stack_fffffffffffff850;
  long local_530;
  double local_500;
  double local_4f8;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_> *local_4d0;
  double local_4c8;
  double local_4c0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_> *local_4b0;
  double local_4a8;
  double local_4a0;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>
  *local_498;
  Scalar local_490;
  ReturnType local_488;
  ReturnType local_480;
  undefined8 local_470;
  double local_468;
  ReturnType local_3a0;
  ReturnType local_2d8;
  long local_2d0;
  double local_2c8;
  Scalar local_2c0;
  undefined8 local_2b8;
  long local_2a0;
  double local_298;
  ReturnType local_290;
  ReturnType local_288;
  double local_218;
  double local_210;
  Scalar local_208;
  Scalar local_200;
  ReturnType local_138;
  double local_130;
  long local_128;
  long local_120;
  double local_118;
  ReturnType local_110;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *local_108;
  double local_100;
  long local_f8;
  long local_f0;
  long local_e8 [24];
  long local_28;
  double local_20;
  Real local_18;
  Index local_10;
  
  local_10 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x2e4054);
  local_18 = GenericNumTraits<double>::epsilon();
  local_20 = 0.0;
  for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 1) {
    DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::row
              (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
    local_e8[2] = local_28 + -1;
    local_e8[1] = 0;
    std::max<long>(local_e8 + 2,local_e8 + 1);
    local_e8[0] = local_28 + -1;
    local_f0 = 0;
    std::max<long>(local_e8,&local_f0);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>::segment
              (in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
               (Index)in_stack_fffffffffffff818);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,_-1,_false>_>
    ::cwiseAbs((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>
                *)in_stack_fffffffffffff828);
    SVar7 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,_-1,_false>_>_>
            ::sum((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>_>
                   *)in_stack_fffffffffffff818);
    local_20 = SVar7 + local_20;
  }
  local_f8 = local_10;
  if ((local_20 != 0.0) || (NAN(local_20))) {
    while (local_f8 = local_f8 + -1, local_530 = local_10, -1 < local_f8) {
      pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                         ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_> *)
                          in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
      local_100 = std::complex<double>::real_abi_cxx11_(pSVar3);
      pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                         ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_> *)
                          in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
      local_108 = (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                   *)std::complex<double>::imag_abi_cxx11_(pSVar3);
      iVar1 = (int)in_RDI;
      if (((double)local_108 != 0.0) || (NAN((double)local_108))) {
        if ((0.0 <= (double)local_108) || (local_f8 < 1)) {
          __assert_fail("0 && \"Internal bug in EigenSolver\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Eigenvalues/EigenSolver.h"
                        ,0x251,
                        "void Eigen::EigenSolver<Eigen::Matrix<double, 2, 2>>::doComputeEigenvectors() [_MatrixType = Eigen::Matrix<double, 2, 2>]"
                       );
        }
        local_288 = 0.0;
        local_290 = 0.0;
        local_298 = 0.0;
        local_2a0 = local_f8 + -1;
        iVar6 = iVar1 + 0x100;
        PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                  ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                   in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                   (Index)in_stack_fffffffffffff820);
        std::abs(iVar6);
        iVar6 = iVar1 + 0x100;
        PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                  ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                   in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                   (Index)in_stack_fffffffffffff820);
        std::abs(iVar6);
        pDVar2 = local_108;
        if (extraout_XMM0_Qa_02 <= extraout_XMM0_Qa_03) {
          local_2b8 = 0;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          local_2c0 = -*pSVar4;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          local_2c8 = *pSVar4 - local_100;
          cdiv<double>((double *)in_stack_fffffffffffff830,(double *)in_stack_fffffffffffff828,
                       (double *)in_stack_fffffffffffff820,(double *)in_stack_fffffffffffff818);
          tVar11 = numext::real<std::complex<double>>((complex<double> *)0x2e4caa);
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          *pSVar4 = tVar11;
          tVar12 = numext::imag<std::complex<double>>((complex<double> *)0x2e4cf9);
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          *pSVar4 = tVar12;
        }
        else {
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          dVar8 = *pSVar4;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          *pSVar4 = (double)pDVar2 / dVar8;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          dVar13 = *pSVar4 - local_100;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          dVar8 = *pSVar4;
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          *pSVar4 = -dVar13 / dVar8;
        }
        pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                            (Index)in_stack_fffffffffffff820);
        *pSVar4 = 0.0;
        pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                            (Index)in_stack_fffffffffffff820);
        *pSVar4 = 1.0;
        for (local_2d0 = local_f8 + -2; -1 < local_2d0; local_2d0 = local_2d0 + -1) {
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::row
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>::segment
                    (in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::segment
                    ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *)
                     in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          local_2d8 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                      ::
                      dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                                (in_stack_fffffffffffff820,
                                 (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                  *)in_stack_fffffffffffff818);
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::row
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>::segment
                    (in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::segment
                    ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *)
                     in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          local_3a0 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                      ::
                      dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                                (in_stack_fffffffffffff820,
                                 (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                  *)in_stack_fffffffffffff818);
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          local_468 = *pSVar4 - local_100;
          pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                               *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
          dVar8 = std::complex<double>::imag_abi_cxx11_(pSVar3);
          if (0.0 <= dVar8) {
            local_2a0 = local_2d0;
            pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                               ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                 *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
            dVar8 = std::complex<double>::imag_abi_cxx11_(pSVar3);
            uVar14 = 0;
            if ((dVar8 != 0.0) || (NAN(dVar8))) {
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              local_490 = *pSVar4;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              local_498 = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>
                           *)*pSVar4;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar8 = std::complex<double>::real_abi_cxx11_(pSVar3);
              dVar8 = dVar8 - local_100;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar13 = std::complex<double>::real_abi_cxx11_(pSVar3);
              dVar13 = dVar13 - local_100;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar9 = std::complex<double>::imag_abi_cxx11_(pSVar3);
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar10 = std::complex<double>::imag_abi_cxx11_(pSVar3);
              local_4a0 = -(double)local_108 * (double)local_108 + dVar8 * dVar13 + dVar9 * dVar10;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar8 = std::complex<double>::real_abi_cxx11_(pSVar3);
              iVar6 = (int)pSVar3;
              local_4a8 = (dVar8 - local_100) * 2.0 * (double)local_108;
              if ((local_4a0 == 0.0) &&
                 (((!NAN(local_4a0) && (local_4a8 == 0.0)) && (!NAN(local_4a8))))) {
                dVar8 = local_18 * local_20;
                std::abs(iVar6);
                std::abs(iVar6);
                std::abs(iVar6);
                std::abs(iVar6);
                std::abs(iVar6);
                local_4a0 = dVar8 * (extraout_XMM0_Qa_04 + extraout_XMM0_Qa_05 + extraout_XMM0_Qa_06
                                     + extraout_XMM0_Qa_07 + extraout_XMM0_Qa_08);
              }
              local_4c0 = (double)local_108 * local_3a0 +
                          local_490 * local_288 + -(local_298 * local_2d8);
              pDVar15 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>
                         *)(local_490 * local_290 + -(local_298 * local_3a0));
              local_4c8 = -(double)local_108 * local_2d8 + (double)pDVar15;
              cdiv<double>((double *)in_stack_fffffffffffff830,(double *)in_stack_fffffffffffff828,
                           (double *)in_stack_fffffffffffff820,(double *)in_stack_fffffffffffff818);
              local_4b0 = pDVar15;
              tVar11 = numext::real<std::complex<double>>((complex<double> *)0x2e5554);
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = tVar11;
              tVar12 = numext::imag<std::complex<double>>((complex<double> *)0x2e559f);
              iVar6 = iVar1 + 0x100;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = tVar12;
              std::abs(iVar6);
              std::abs(iVar6);
              std::abs(iVar6);
              dVar8 = local_468;
              if (extraout_XMM0_Qa_09 <= extraout_XMM0_Qa_10 + extraout_XMM0_Qa_11) {
                in_stack_fffffffffffff818 =
                     (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                     ((ulong)local_288 ^ 0x8000000000000000);
                in_stack_fffffffffffff810 = local_498;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                local_4e0 = -(double)in_stack_fffffffffffff810 * *pSVar4 +
                            (double)in_stack_fffffffffffff818;
                pDVar15 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>
                           *)((ulong)local_290 ^ 0x8000000000000000);
                in_stack_fffffffffffff820 = local_498;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)pDVar15,(Index)local_498);
                local_4e8 = -(double)in_stack_fffffffffffff820 * *pSVar4 + (double)pDVar15;
                in_stack_fffffffffffff828 = pDVar15;
                cdiv<double>((double *)in_stack_fffffffffffff830,(double *)pDVar15,
                             (double *)in_stack_fffffffffffff820,(double *)in_stack_fffffffffffff818
                            );
                local_4d0 = pDVar15;
                local_4b0 = pDVar15;
                in_stack_fffffffffffff830 =
                     (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                     numext::real<std::complex<double>>((complex<double> *)0x2e5a24);
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                *pSVar4 = (Scalar)in_stack_fffffffffffff830;
                tVar12 = numext::imag<std::complex<double>>((complex<double> *)0x2e5a6d);
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                *pSVar4 = tVar12;
              }
              else {
                in_stack_fffffffffffff848 = (Scalar *)((ulong)local_2d8 ^ 0x8000000000000000);
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                dVar8 = -dVar8 * *pSVar4 + (double)in_stack_fffffffffffff848;
                in_stack_fffffffffffff850 = local_108;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                dVar8 = ((double)in_stack_fffffffffffff850 * *pSVar4 + dVar8) / local_490;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                dVar13 = local_468;
                *pSVar4 = dVar8;
                dVar9 = -local_3a0;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                pDVar2 = local_108;
                dVar8 = *pSVar4;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                dVar8 = (-(double)pDVar2 * *pSVar4 + -dVar13 * dVar8 + dVar9) / local_490;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                *pSVar4 = dVar8;
              }
            }
            else {
              local_480 = -local_2d8;
              local_488 = -local_3a0;
              cdiv<double>((double *)in_stack_fffffffffffff830,(double *)in_stack_fffffffffffff828,
                           (double *)in_stack_fffffffffffff820,(double *)in_stack_fffffffffffff818);
              local_470 = uVar14;
              tVar11 = numext::real<std::complex<double>>((complex<double> *)0x2e50c9);
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = tVar11;
              tVar12 = numext::imag<std::complex<double>>((complex<double> *)0x2e5114);
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = tVar12;
            }
            iVar6 = iVar1 + 0x100;
            PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                      ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                       in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                       (Index)in_stack_fffffffffffff820);
            std::abs(iVar6);
            iVar6 = iVar1 + 0x100;
            PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                      ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                       in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                       (Index)in_stack_fffffffffffff820);
            std::abs(iVar6);
            pdVar5 = std::max<double>(&local_4f8,&local_500);
            local_4f0 = *pdVar5;
            if (1.0 < local_18 * local_4f0 * local_4f0) {
              DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::block
                        (in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                         (Index)in_stack_fffffffffffff820,(Index)in_stack_fffffffffffff818,
                         (Index)in_stack_fffffffffffff810);
              DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::
              operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
                          *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
            }
          }
          else {
            local_298 = local_468;
            local_288 = local_2d8;
            local_290 = local_3a0;
          }
        }
        local_f8 = local_f8 + -1;
      }
      else {
        local_110 = 0.0;
        local_118 = 0.0;
        local_120 = local_f8;
        pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                            in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                            (Index)in_stack_fffffffffffff820);
        *pSVar4 = 1.0;
        local_128 = local_f8;
        while (local_128 = local_128 + -1, -1 < local_128) {
          pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                              in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                              (Index)in_stack_fffffffffffff820);
          local_130 = *pSVar4 - local_100;
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::row
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>_>::segment
                    (in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                    (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::segment
                    ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *)
                     in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                     (Index)in_stack_fffffffffffff818);
          local_138 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                      ::
                      dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                                (in_stack_fffffffffffff820,
                                 (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                  *)in_stack_fffffffffffff818);
          pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                               *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
          dVar8 = std::complex<double>::imag_abi_cxx11_(pSVar3);
          if (0.0 <= dVar8) {
            local_120 = local_128;
            pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                               ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                 *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
            dVar8 = std::complex<double>::imag_abi_cxx11_(pSVar3);
            if ((dVar8 != 0.0) || (NAN(dVar8))) {
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              local_200 = *pSVar4;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              local_208 = *pSVar4;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar8 = std::complex<double>::real_abi_cxx11_(pSVar3);
              dVar8 = dVar8 - local_100;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar13 = std::complex<double>::real_abi_cxx11_(pSVar3);
              dVar13 = dVar13 - local_100;
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar9 = std::complex<double>::imag_abi_cxx11_(pSVar3);
              pSVar3 = PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>::coeff
                                 ((PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                                   *)in_stack_fffffffffffff810,(Index)in_stack_fffffffffffff808);
              dVar10 = std::complex<double>::imag_abi_cxx11_(pSVar3);
              local_210 = dVar8 * dVar13 + dVar9 * dVar10;
              dVar8 = (local_200 * local_110 + -(local_118 * local_138)) / local_210;
              iVar6 = iVar1 + 0x100;
              local_218 = dVar8;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = dVar8;
              std::abs(iVar6);
              std::abs(iVar6);
              if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
                dVar8 = (-local_208 * local_218 + -local_110) / local_118;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                *pSVar4 = dVar8;
              }
              else {
                dVar8 = (-local_130 * local_218 + -local_138) / local_200;
                pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                   ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                    in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                    (Index)in_stack_fffffffffffff820);
                *pSVar4 = dVar8;
              }
            }
            else if ((local_130 != 0.0) || (NAN(local_130))) {
              dVar8 = -local_138 / local_130;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = dVar8;
            }
            else {
              dVar8 = -local_138;
              dVar13 = local_18 * local_20;
              pSVar4 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                                 ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                                  in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                                  (Index)in_stack_fffffffffffff820);
              *pSVar4 = dVar8 / dVar13;
            }
            iVar6 = iVar1 + 0x100;
            PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                      ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                       in_stack_fffffffffffff830,(Index)in_stack_fffffffffffff828,
                       (Index)in_stack_fffffffffffff820);
            std::abs(iVar6);
            if (1.0 < local_18 * extraout_XMM0_Qa_01 * extraout_XMM0_Qa_01) {
              DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                        (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
              DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
                        ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>
                          *)in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820);
              DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
              ::operator/=(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
            }
          }
          else {
            local_118 = local_130;
            local_110 = local_138;
          }
        }
      }
    }
    while (local_530 = local_530 + -1, -1 < local_530) {
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::leftCols
                ((DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)in_stack_fffffffffffff828,
                 (Index)in_stack_fffffffffffff820);
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::segment
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *)
                 in_stack_fffffffffffff828,(Index)in_stack_fffffffffffff820,
                 (Index)in_stack_fffffffffffff818);
      MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *)
                 in_stack_fffffffffffff828,
                 (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                  *)in_stack_fffffffffffff820);
      MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)in_stack_fffffffffffff808);
      NoAlias<Eigen::Matrix<double,2,1,0,2,1>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff810,
                 (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>_>
                  *)in_stack_fffffffffffff808);
      in_stack_fffffffffffff808 =
           (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(in_RDI + 0x120);
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::col
                (in_stack_fffffffffffff818,(Index)in_stack_fffffffffffff810);
      Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>::operator=
                ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)
                 in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    }
  }
  return;
}

Assistant:

void EigenSolver<MatrixType>::doComputeEigenvectors()
{
  using std::abs;
  const Index size = m_eivec.cols();
  const Scalar eps = NumTraits<Scalar>::epsilon();

  // inefficient! this is already computed in RealSchur
  Scalar norm(0);
  for (Index j = 0; j < size; ++j)
  {
    norm += m_matT.row(j).segment((std::max)(j-1,Index(0)), size-(std::max)(j-1,Index(0))).cwiseAbs().sum();
  }
  
  // Backsubstitute to find vectors of upper triangular form
  if (norm == 0.0)
  {
    return;
  }

  for (Index n = size-1; n >= 0; n--)
  {
    Scalar p = m_eivalues.coeff(n).real();
    Scalar q = m_eivalues.coeff(n).imag();

    // Scalar vector
    if (q == Scalar(0))
    {
      Scalar lastr(0), lastw(0);
      Index l = n;

      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-1; i >= 0; i--)
      {
        Scalar w = m_matT.coeff(i,i) - p;
        Scalar r = m_matT.row(i).segment(l,n-l+1).dot(m_matT.col(n).segment(l, n-l+1));

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastr = r;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == 0.0)
          {
            if (w != 0.0)
              m_matT.coeffRef(i,n) = -r / w;
            else
              m_matT.coeffRef(i,n) = -r / (eps * norm);
          }
          else // Solve real equations
          {
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar denom = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag();
            Scalar t = (x * lastr - lastw * r) / denom;
            m_matT.coeffRef(i,n) = t;
            if (abs(x) > abs(lastw))
              m_matT.coeffRef(i+1,n) = (-r - w * t) / x;
            else
              m_matT.coeffRef(i+1,n) = (-lastr - y * t) / lastw;
          }

          // Overflow control
          Scalar t = abs(m_matT.coeff(i,n));
          if ((eps * t) * t > Scalar(1))
            m_matT.col(n).tail(size-i) /= t;
        }
      }
    }
    else if (q < Scalar(0) && n > 0) // Complex vector
    {
      Scalar lastra(0), lastsa(0), lastw(0);
      Index l = n-1;

      // Last vector component imaginary so matrix is triangular
      if (abs(m_matT.coeff(n,n-1)) > abs(m_matT.coeff(n-1,n)))
      {
        m_matT.coeffRef(n-1,n-1) = q / m_matT.coeff(n,n-1);
        m_matT.coeffRef(n-1,n) = -(m_matT.coeff(n,n) - p) / m_matT.coeff(n,n-1);
      }
      else
      {
        std::complex<Scalar> cc = cdiv<Scalar>(0.0,-m_matT.coeff(n-1,n),m_matT.coeff(n-1,n-1)-p,q);
        m_matT.coeffRef(n-1,n-1) = numext::real(cc);
        m_matT.coeffRef(n-1,n) = numext::imag(cc);
      }
      m_matT.coeffRef(n,n-1) = 0.0;
      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-2; i >= 0; i--)
      {
        Scalar ra = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n-1).segment(l, n-l+1));
        Scalar sa = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n).segment(l, n-l+1));
        Scalar w = m_matT.coeff(i,i) - p;

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastra = ra;
          lastsa = sa;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == RealScalar(0))
          {
            std::complex<Scalar> cc = cdiv(-ra,-sa,w,q);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
          }
          else
          {
            // Solve complex equations
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar vr = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag() - q * q;
            Scalar vi = (m_eivalues.coeff(i).real() - p) * Scalar(2) * q;
            if ((vr == 0.0) && (vi == 0.0))
              vr = eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(lastw));

            std::complex<Scalar> cc = cdiv(x*lastra-lastw*ra+q*sa,x*lastsa-lastw*sa-q*ra,vr,vi);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
            if (abs(x) > (abs(lastw) + abs(q)))
            {
              m_matT.coeffRef(i+1,n-1) = (-ra - w * m_matT.coeff(i,n-1) + q * m_matT.coeff(i,n)) / x;
              m_matT.coeffRef(i+1,n) = (-sa - w * m_matT.coeff(i,n) - q * m_matT.coeff(i,n-1)) / x;
            }
            else
            {
              cc = cdiv(-lastra-y*m_matT.coeff(i,n-1),-lastsa-y*m_matT.coeff(i,n),lastw,q);
              m_matT.coeffRef(i+1,n-1) = numext::real(cc);
              m_matT.coeffRef(i+1,n) = numext::imag(cc);
            }
          }

          // Overflow control
          using std::max;
          Scalar t = (max)(abs(m_matT.coeff(i,n-1)),abs(m_matT.coeff(i,n)));
          if ((eps * t) * t > Scalar(1))
            m_matT.block(i, n-1, size-i, 2) /= t;

        }
      }
      
      // We handled a pair of complex conjugate eigenvalues, so need to skip them both
      n--;
    }
    else
    {
      eigen_assert(0 && "Internal bug in EigenSolver"); // this should not happen
    }
  }

  // Back transformation to get eigenvectors of original matrix
  for (Index j = size-1; j >= 0; j--)
  {
    m_tmp.noalias() = m_eivec.leftCols(j+1) * m_matT.col(j).segment(0, j+1);
    m_eivec.col(j) = m_tmp;
  }
}